

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5IterNextScan(Fts5IndexIter *pIndexIter)

{
  Fts5Index *p_00;
  long lVar1;
  Fts5IndexIter *pFVar2;
  int iVar3;
  ulong uVar4;
  Fts5SegIter *pSeg;
  Fts5Index *p;
  Fts5Iter *pIter;
  Fts5IndexIter *pIndexIter_local;
  
  p_00 = (Fts5Index *)pIndexIter[1].iRowid;
  fts5MultiIterNext(p_00,(Fts5Iter *)pIndexIter,0,0);
  if (((p_00->rc == 0) &&
      (uVar4 = (ulong)*(ushort *)(*(long *)&pIndexIter[3].nData + 4),
      pFVar2 = pIndexIter + uVar4 * 5 + 4, lVar1._0_4_ = pFVar2->nData, lVar1._4_1_ = pFVar2->bEof,
      lVar1._5_3_ = *(undefined3 *)&pFVar2->field_0x15, lVar1 != 0)) &&
     (**(char **)&pIndexIter[uVar4 * 5 + 7].nData != '0')) {
    fts5DataRelease(*(Fts5Data **)&pIndexIter[uVar4 * 5 + 4].nData);
    pFVar2 = pIndexIter + uVar4 * 5 + 4;
    pFVar2->nData = 0;
    pFVar2->bEof = '\0';
    *(undefined3 *)&pFVar2->field_0x15 = 0;
    pIndexIter->bEof = '\x01';
  }
  iVar3 = fts5IndexReturn((Fts5Index *)pIndexIter[1].iRowid);
  return iVar3;
}

Assistant:

static int sqlite3Fts5IterNextScan(Fts5IndexIter *pIndexIter){
  Fts5Iter *pIter = (Fts5Iter*)pIndexIter;
  Fts5Index *p = pIter->pIndex;

  assert( pIter->pIndex->rc==SQLITE_OK );

  fts5MultiIterNext(p, pIter, 0, 0);
  if( p->rc==SQLITE_OK ){
    Fts5SegIter *pSeg = &pIter->aSeg[ pIter->aFirst[1].iFirst ];
    if( pSeg->pLeaf && pSeg->term.p[0]!=FTS5_MAIN_PREFIX ){
      fts5DataRelease(pSeg->pLeaf);
      pSeg->pLeaf = 0;
      pIter->base.bEof = 1;
    }
  }

  return fts5IndexReturn(pIter->pIndex);
}